

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O1

unsigned_long_long __thiscall
KarpRabinHash<unsigned_long_long,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_long_long,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  _Elt_pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  _Elt_pointer puVar12;
  
  ppuVar1 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar8 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur +
                 ((((((ulong)((long)ppuVar1 - (long)ppuVar3) >> 3) - 1) +
                   (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_first) - (long)puVar2));
  if (puVar8 == (_Elt_pointer)0x0) {
    return 0;
  }
  uVar4 = *(ulong *)(this + 0x810);
  uVar9 = 0;
  uVar5 = 0;
  do {
    uVar6 = 1;
    if (puVar8 + ~uVar9 != (_Elt_pointer)0x0) {
      uVar7 = 1;
      do {
        uVar6 = uVar6 * 0x25 & uVar4;
        puVar12 = (_Elt_pointer)(ulong)uVar7;
        uVar7 = uVar7 + 1;
      } while (puVar12 < puVar8 + ~uVar9);
    }
    puVar12 = puVar2 + (uVar9 - (long)(c->
                                      super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Deque_impl_data._M_start._M_first);
    if (puVar12 < (_Elt_pointer)0x200) {
      pbVar11 = puVar2 + uVar9;
    }
    else {
      uVar10 = ((ulong)puVar12 >> 9) + 0xff80000000000000;
      if (0 < (long)puVar12) {
        uVar10 = (ulong)puVar12 >> 9;
      }
      pbVar11 = ppuVar3[uVar10] + (long)(puVar12 + uVar10 * -0x200);
    }
    uVar5 = uVar5 + (uVar6 * *(long *)(this + (ulong)*pbVar11 * 8 + 0x10) & uVar4) & uVar4;
    uVar9 = uVar9 + 1;
  } while ((_Elt_pointer)(uVar9 & 0xffffffff) < puVar8);
  return uVar5;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }